

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  connectdata *pcVar1;
  bool bVar2;
  CURLMcode CVar3;
  long *plVar4;
  Curl_tree *pCVar5;
  curl_llist_element *pcVar6;
  undefined7 in_register_00000031;
  SessionHandle *pSVar7;
  timeval now;
  Curl_tree *t;
  int local_44;
  Curl_tree *local_40;
  int *local_38;
  
  local_44 = s;
  now = curlx_tvnow();
  if ((int)CONCAT71(in_register_00000031,checkall) == 0) {
    local_38 = running_handles;
    if (local_44 == -1) {
      (multi->timer_lastcall).tv_sec = 0;
      (multi->timer_lastcall).tv_usec = 0;
      pSVar7 = (SessionHandle *)0x0;
      CVar3 = CURLM_OK;
    }
    else {
      plVar4 = (long *)Curl_hash_pick(multi->sockhash,&local_44,4);
      bVar2 = true;
      if (plVar4 == (long *)0x0) {
        pSVar7 = (SessionHandle *)0x0;
        CVar3 = CURLM_OK;
      }
      else {
        pSVar7 = (SessionHandle *)*plVar4;
        CVar3 = CURLM_OK;
        if (pSVar7->magic == 0xc0dedbad) {
          pcVar1 = pSVar7->easy_conn;
          if ((pcVar1 != (connectdata *)0x0) &&
             (((((ev_bitmask & 2U) != 0 && (pcVar1->send_pipe != (curl_llist *)0x0)) &&
               (pcVar6 = pcVar1->send_pipe->head, pcVar6 != (curl_llist_element *)0x0)) ||
              ((((ev_bitmask & 1U) != 0 && (pcVar1->recv_pipe != (curl_llist *)0x0)) &&
               (pcVar6 = pcVar1->recv_pipe->head, pcVar6 != (curl_llist_element *)0x0)))))) {
            pSVar7 = (SessionHandle *)pcVar6->ptr;
          }
          pcVar1 = pSVar7->easy_conn;
          if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
            pcVar1->cselect_bits = ev_bitmask;
          }
          do {
            CVar3 = multi_runsingle(multi,now,pSVar7);
          } while (CVar3 == CURLM_CALL_MULTI_PERFORM);
          pcVar1 = pSVar7->easy_conn;
          if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
            pcVar1->cselect_bits = 0;
          }
          if (CVar3 < CURLM_BAD_HANDLE) {
            singlesocket(multi,pSVar7);
          }
          now = curlx_tvnow();
          pSVar7 = (SessionHandle *)0x0;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      if (!bVar2) {
        return CURLM_INTERNAL_ERROR;
      }
    }
    do {
      if (pSVar7 != (SessionHandle *)0x0) {
        do {
          CVar3 = multi_runsingle(multi,now,pSVar7);
        } while (CVar3 == CURLM_CALL_MULTI_PERFORM);
        if (CVar3 < CURLM_BAD_HANDLE) {
          singlesocket(multi,pSVar7);
        }
      }
      pCVar5 = Curl_splaygetbest(now,multi->timetree,&local_40);
      multi->timetree = pCVar5;
      if (local_40 != (Curl_tree *)0x0) {
        pSVar7 = (SessionHandle *)local_40->payload;
        add_next_timeout(now,multi,pSVar7);
      }
    } while (local_40 != (Curl_tree *)0x0);
    *local_38 = multi->num_alive;
  }
  else {
    CVar3 = curl_multi_perform(multi,running_handles);
    if (CVar3 != CURLM_BAD_HANDLE) {
      for (pSVar7 = multi->easyp; pSVar7 != (SessionHandle *)0x0; pSVar7 = pSVar7->next) {
        singlesocket(multi,pSVar7);
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct SessionHandle *data = NULL;
  struct Curl_tree *t;
  struct timeval now = Curl_tvnow();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data=multi->easyp;
      while(data) {
        singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  else if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry =
      Curl_hash_pick(multi->sockhash, (char *)&s, sizeof(s));

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      SIGPIPE_VARIABLE(pipe_st);

      data = entry->easy;

      if(data->magic != CURLEASY_MAGIC_NUMBER)
        /* bad bad bad bad bad bad bad */
        return CURLM_INTERNAL_ERROR;

      /* If the pipeline is enabled, take the handle which is in the head of
         the pipeline. If we should write into the socket, take the send_pipe
         head.  If we should read from the socket, take the recv_pipe head. */
      if(data->easy_conn) {
        if((ev_bitmask & CURL_POLL_OUT) &&
           data->easy_conn->send_pipe &&
           data->easy_conn->send_pipe->head)
          data = data->easy_conn->send_pipe->head->ptr;
        else if((ev_bitmask & CURL_POLL_IN) &&
                data->easy_conn->recv_pipe &&
                data->easy_conn->recv_pipe->head)
          data = data->easy_conn->recv_pipe->head->ptr;
      }

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* set socket event bitmask if they're not locked */
        data->easy_conn->cselect_bits = ev_bitmask;

      sigpipe_ignore(data, &pipe_st);
      do
        result = multi_runsingle(multi, now, data);
      while(CURLM_CALL_MULTI_PERFORM == result);
      sigpipe_restore(&pipe_st);

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* clear the bitmask only if not locked */
        data->easy_conn->cselect_bits = 0;

      if(CURLM_OK >= result)
        /* get the socket(s) and check if the state has been changed since
           last */
        singlesocket(multi, data);

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_tvnow(); /* get a newer time since the multi_runsingle() loop
                             may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      do
        result = multi_runsingle(multi, now, data);
      while(CURLM_CALL_MULTI_PERFORM == result);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result)
        /* get the socket(s) and check if the state has been changed since
           last */
        singlesocket(multi, data);
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}